

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringCache.h
# Opt level: O0

JavascriptString * __thiscall
Js::StringCache::InitializeString<true,8ul>(StringCache *this,char16 (*value) [8])

{
  code *pcVar1;
  bool bVar2;
  PropertyId PVar3;
  BOOL BVar4;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  PropertyString *pPVar7;
  PropertyRecord *local_20;
  PropertyRecord *propertyRecord;
  char16 (*value_local) [8];
  StringCache *this_local;
  
  local_20 = (PropertyRecord *)0x0;
  propertyRecord = (PropertyRecord *)value;
  value_local = (char16 (*) [8])this;
  pSVar5 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
  ScriptContext::FindPropertyRecord(pSVar5,(LPCWSTR)propertyRecord,7,&local_20);
  if (local_20 == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/StringCache.h"
                                ,0x43,"(propertyRecord != nullptr)",
                                "Trying to create a propertystring for non property string?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  PVar3 = PropertyRecord::GetPropertyId(local_20);
  BVar4 = IsBuiltInPropertyId(PVar3);
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/StringCache.h"
                                ,0x44,"(IsBuiltInPropertyId(propertyRecord->GetPropertyId()))",
                                "IsBuiltInPropertyId(propertyRecord->GetPropertyId())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pSVar5 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->(&this->scriptContext);
  PVar3 = PropertyRecord::GetPropertyId(local_20);
  pPVar7 = ScriptContext::GetPropertyString(pSVar5,PVar3);
  return &pPVar7->super_JavascriptString;
}

Assistant:

JavascriptString* InitializeString(const char16(&value)[N]) const
    {
        if (withPropertyString)
        {
            const PropertyRecord* propertyRecord = nullptr;
            scriptContext->FindPropertyRecord(value, N - 1, &propertyRecord);
            AssertMsg(propertyRecord != nullptr, "Trying to create a propertystring for non property string?");
            Assert(IsBuiltInPropertyId(propertyRecord->GetPropertyId()));
            return scriptContext->GetPropertyString(propertyRecord->GetPropertyId());
        }
        else
        {
            return LiteralString::New(stringTypeStatic, value, N - 1 /*don't include terminating NUL*/, scriptContext->GetRecycler());
        }
    }